

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O2

void __thiscall
helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>::
generateLocalAddressString_abi_cxx11_
          (NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6> *this)

{
  long in_RSI;
  
  generateLocalAddressString_abi_cxx11_
            ((string *)this,
             (NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6> *)
             (in_RSI + -8));
  return;
}

Assistant:

std::string NetworkBroker<COMMS, baseline, tcode>::generateLocalAddressString() const
{
    using InterfaceTypes = gmlc::networking::InterfaceTypes;
    std::string add;
    if (CommsBroker<COMMS, CoreBroker>::comms->isConnected()) {
        add = CommsBroker<COMMS, CoreBroker>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CoreBroker::getIdentifier();
                }
                break;
        }
    }
    return add;
}